

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

ListSchema capnp::ListSchema::of(Which primitiveType)

{
  int iVar1;
  undefined6 in_register_0000003a;
  Fault f;
  Fault local_10;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,primitiveType);
  if (iVar1 - 0xeU < 4) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[72]>
              (&local_10,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x2d7,FAILED,(char *)0x0,
               "\"Must use one of the other ListSchema::of() overloads for complex types.\"",
               (char (*) [72])
               "Must use one of the other ListSchema::of() overloads for complex types.");
    kj::_::Debug::Fault::fatal(&local_10);
  }
  if (iVar1 != 0x12) {
    return (Type)ZEXT216(primitiveType);
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
             ,0x2db,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
             (char (*) [32])"List(AnyPointer) not supported.");
  kj::_::Debug::Fault::fatal(&local_10);
}

Assistant:

ListSchema ListSchema::of(schema::Type::Which primitiveType) {
  switch (primitiveType) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      break;

    case schema::Type::STRUCT:
    case schema::Type::ENUM:
    case schema::Type::INTERFACE:
    case schema::Type::LIST:
      KJ_FAIL_REQUIRE("Must use one of the other ListSchema::of() overloads for complex types.");
      break;

    case schema::Type::ANY_POINTER:
      KJ_FAIL_REQUIRE("List(AnyPointer) not supported.");
      break;
  }

  return ListSchema(primitiveType);
}